

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamWriter_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamWriterPrivate::WriteReferences
          (BamWriterPrivate *this,RefVector *referenceSequences)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  pointer pRVar4;
  vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *in_RSI;
  __normal_iterator<const_BamTools::RefData_*,_std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>
  *in_RDI;
  char *unaff_retaddr;
  BgzfStream *in_stack_00000008;
  int32_t referenceLength;
  uint32_t maybeSwappedNameLen;
  uint32_t actualNameLen;
  const_iterator rsEnd;
  const_iterator rsIter;
  uint32_t numReferenceSequences;
  vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *in_stack_ffffffffffffffb8;
  int32_t local_34;
  uint32_t local_30;
  uint32_t local_2c;
  RefData *local_28;
  __normal_iterator<const_BamTools::RefData_*,_std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>
  local_20;
  uint32_t local_14 [3];
  __normal_iterator<const_BamTools::RefData_*,_std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>
  *dataLength;
  
  dataLength = in_RDI;
  sVar3 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::size(in_RSI);
  local_14[0] = (uint32_t)sVar3;
  if (((ulong)in_RDI[8]._M_current & 1) != 0) {
    SwapEndian_32(local_14);
  }
  BgzfStream::Write(in_stack_00000008,unaff_retaddr,(size_t)dataLength);
  local_20._M_current =
       (RefData *)
       std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::begin
                 (in_stack_ffffffffffffffb8);
  local_28 = (RefData *)
             std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::end
                       (in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<const_BamTools::RefData_*,_std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>
                               *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_BamTools::RefData_*,_std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>
    ::operator->(&local_20);
    iVar2 = std::__cxx11::string::size();
    local_30 = iVar2 + 1;
    local_2c = local_30;
    if (((ulong)in_RDI[8]._M_current & 1) != 0) {
      SwapEndian_32(&local_30);
    }
    BgzfStream::Write(in_stack_00000008,unaff_retaddr,(size_t)dataLength);
    __gnu_cxx::
    __normal_iterator<const_BamTools::RefData_*,_std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>
    ::operator->(&local_20);
    std::__cxx11::string::c_str();
    BgzfStream::Write(in_stack_00000008,unaff_retaddr,(size_t)dataLength);
    pRVar4 = __gnu_cxx::
             __normal_iterator<const_BamTools::RefData_*,_std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>
             ::operator->(&local_20);
    local_34 = pRVar4->RefLength;
    if (((ulong)in_RDI[8]._M_current & 1) != 0) {
      SwapEndian_32(&local_34);
    }
    BgzfStream::Write(in_stack_00000008,unaff_retaddr,(size_t)dataLength);
    __gnu_cxx::
    __normal_iterator<const_BamTools::RefData_*,_std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void BamWriterPrivate::WriteReferences(const BamTools::RefVector& referenceSequences)
{

    // write the number of reference sequences
    uint32_t numReferenceSequences = referenceSequences.size();
    if (m_isBigEndian) BamTools::SwapEndian_32(numReferenceSequences);
    m_stream.Write((char*)&numReferenceSequences, Constants::BAM_SIZEOF_INT);

    // foreach reference sequence
    RefVector::const_iterator rsIter = referenceSequences.begin();
    RefVector::const_iterator rsEnd = referenceSequences.end();
    for (; rsIter != rsEnd; ++rsIter) {

        // write the reference sequence name length (+1 for terminator)
        const uint32_t actualNameLen = rsIter->RefName.size() + 1;
        uint32_t maybeSwappedNameLen = actualNameLen;
        if (m_isBigEndian) BamTools::SwapEndian_32(maybeSwappedNameLen);
        m_stream.Write((char*)&maybeSwappedNameLen, Constants::BAM_SIZEOF_INT);

        // write the reference sequence name
        m_stream.Write(rsIter->RefName.c_str(), actualNameLen);

        // write the reference sequence length
        int32_t referenceLength = rsIter->RefLength;
        if (m_isBigEndian) BamTools::SwapEndian_32(referenceLength);
        m_stream.Write((char*)&referenceLength, Constants::BAM_SIZEOF_INT);
    }
}